

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O2

SyntaxToken * __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
::lastToken(SyntaxToken *__return_storage_ptr__,
           CoreSyntaxNodeList<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
           *this)

{
  ExtKR_ParameterDeclarationSyntax *this_00;
  
  this_00 = List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
            ::lastValue(&this->
                         super_List<psy::C::ExtKR_ParameterDeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::ExtKR_ParameterDeclarationSyntax_*>_>
                       );
  if (this_00 == (ExtKR_ParameterDeclarationSyntax *)0x0) {
    SyntaxToken::invalid();
  }
  else {
    C::SyntaxNode::lastToken(__return_storage_ptr__,(SyntaxNode *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual SyntaxToken lastToken() const override
    {
        SyntaxNodeT node = this->lastValue();
        if (node)
            return node->lastToken();
        return SyntaxToken::invalid();
    }